

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex(PaHostApiTypeId type)

{
  long lVar1;
  
  if (initializationCount_ == 0) {
    return -10000;
  }
  if (0 < (long)hostApisCount_) {
    lVar1 = 0;
    do {
      if ((hostApis_[lVar1]->info).type == type) {
        return (PaHostApiIndex)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (hostApisCount_ != lVar1);
  }
  return -0x26fb;
}

Assistant:

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex( PaHostApiTypeId type )
{
    PaHostApiIndex result;
    int i;
    
    PA_LOGAPI_ENTER_PARAMS( "Pa_HostApiTypeIdToHostApiIndex" );
    PA_LOGAPI(("\tPaHostApiTypeId type: %d\n", type ));

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;
        
        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                result = i;
                break;
            }         
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_HostApiTypeIdToHostApiIndex", "PaHostApiIndex: %d", result );

    return result;
}